

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesWidget.cxx
# Opt level: O3

void __thiscall
cmCursesWidget::cmCursesWidget(cmCursesWidget *this,int width,int height,int left,int top)

{
  FIELD *field;
  
  this->_vptr_cmCursesWidget = (_func_int **)&PTR__cmCursesWidget_005b7160;
  (this->Value)._M_dataplus._M_p = (pointer)&(this->Value).field_2;
  (this->Value)._M_string_length = 0;
  (this->Value).field_2._M_local_buf[0] = '\0';
  field = new_field(height,width,top,left,0,0);
  this->Field = field;
  set_field_userptr(field,this);
  field_opts_off(this->Field,0x40);
  this->Page = 0;
  return;
}

Assistant:

cmCursesWidget::cmCursesWidget(int width, int height, int left, int top)
{
  this->Field = new_field(height, width, top, left, 0, 0);
  set_field_userptr(this->Field, reinterpret_cast<char*>(this));
  field_opts_off(this->Field, O_AUTOSKIP);
  this->Page = 0;
}